

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

Expression * __thiscall
wasm::OptimizeInstructions::optimizeBoolean(OptimizeInstructions *this,Expression *boolean)

{
  int *piVar1;
  bool bVar2;
  uint uVar3;
  int32_t iVar4;
  Id IVar5;
  Index bits;
  Expression *pEVar6;
  Expression **ppEVar7;
  Literal *pLVar8;
  ulong index;
  Literal local_78;
  Literal local_60;
  Literal local_48;
  
  IVar5 = boolean->_id;
  if (boolean != (Expression *)0x0 && IVar5 == UnaryId) {
    if (boolean[1]._id != MemorySizeId) {
      return boolean;
    }
    pEVar6 = (Expression *)boolean[1].type.id;
    if (pEVar6->_id == BinaryId) {
      IVar5 = invertBinaryOp(this,pEVar6[1]._id);
      if (IVar5 == 0xcb) {
        return boolean;
      }
      pEVar6[1]._id = IVar5;
      return pEVar6;
    }
    if (pEVar6->_id != UnaryId) {
      return boolean;
    }
    if (pEVar6[1]._id != MemorySizeId) {
      return boolean;
    }
    return (Expression *)pEVar6[1].type.id;
  }
  if (IVar5 != BinaryId || boolean == (Expression *)0x0) {
    if (IVar5 == BlockId && boolean != (Expression *)0x0) {
      if ((boolean->type).id != 2) {
        return boolean;
      }
      if (boolean[2].type.id == 0) {
        return boolean;
      }
      ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (boolean + 2));
      pEVar6 = optimizeBoolean(this,*ppEVar7);
      ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (boolean + 2));
      *ppEVar7 = pEVar6;
      return boolean;
    }
    if (IVar5 == IfId && boolean != (Expression *)0x0) {
      if ((boolean->type).id != 2) {
        return boolean;
      }
      pEVar6 = optimizeBoolean(this,(Expression *)boolean[1].type.id);
      boolean[1].type.id = (uintptr_t)pEVar6;
      pEVar6 = optimizeBoolean(this,*(Expression **)(boolean + 2));
      *(Expression **)(boolean + 2) = pEVar6;
      return boolean;
    }
    if (IVar5 != SelectId || boolean == (Expression *)0x0) {
      if (IVar5 != TryId || boolean == (Expression *)0x0) {
        return boolean;
      }
      if ((boolean->type).id != 2) {
        return boolean;
      }
      pEVar6 = optimizeBoolean(this,*(Expression **)(boolean + 2));
      *(Expression **)(boolean + 2) = pEVar6;
      for (uVar3 = 0; index = (ulong)uVar3, index < *(ulong *)(boolean + 5); uVar3 = uVar3 + 1) {
        ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *
                             )&boolean[4].type,index);
        pEVar6 = optimizeBoolean(this,*ppEVar7);
        ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *
                             )&boolean[4].type,index);
        *ppEVar7 = pEVar6;
      }
      return boolean;
    }
    pEVar6 = optimizeBoolean(this,*(Expression **)(boolean + 1));
    *(Expression **)(boolean + 1) = pEVar6;
    pEVar6 = optimizeBoolean(this,(Expression *)boolean[1].type.id);
    boolean[1].type.id = (uintptr_t)pEVar6;
    return boolean;
  }
  IVar5 = boolean[1]._id;
  if (IVar5 == BinaryId) {
    if ((**(int **)(boolean + 2) == 0xe) &&
       (iVar4 = Literal::geti32((Literal *)(*(int **)(boolean + 2) + 4)), iVar4 == 0)) {
      return (Expression *)boolean[1].type.id;
    }
  }
  else if (IVar5 == SwitchId) {
    if (**(int **)(boolean + 2) == 0xe) {
      pLVar8 = (Literal *)(*(int **)(boolean + 2) + 4);
      bVar2 = Literal::isSignedMin(pLVar8);
      if (bVar2) {
LAB_008ea46a:
        boolean[1]._id = CallIndirectId;
        bVar2 = Literal::isSignedMin(pLVar8);
        if (bVar2) {
          Literal::makeSignedMax(&local_48,(Type)0x2);
          Literal::operator=(pLVar8,&local_48);
          pLVar8 = &local_48;
        }
        else {
          Literal::abs(&local_78,(int)pLVar8);
          Literal::makeOne(&local_60,(Type)0x2);
          Literal::sub(&local_48,&local_78,&local_60);
          Literal::operator=(pLVar8,&local_48);
          Literal::~Literal(&local_48);
          Literal::~Literal(&local_60);
          pLVar8 = &local_78;
        }
        Literal::~Literal(pLVar8);
        return boolean;
      }
      Literal::abs(&local_48,(int)pLVar8);
      uVar3 = Literal::geti32(&local_48);
      if (uVar3 == 0) {
        Literal::~Literal(&local_48);
      }
      else {
        Literal::~Literal(&local_48);
        if ((uVar3 & uVar3 - 1) == 0) goto LAB_008ea46a;
      }
    }
  }
  else if (IVar5 == LocalGetId) {
    pEVar6 = optimizeBoolean(this,(Expression *)boolean[1].type.id);
    boolean[1].type.id = (uintptr_t)pEVar6;
    pEVar6 = optimizeBoolean(this,*(Expression **)(boolean + 2));
    *(Expression **)(boolean + 2) = pEVar6;
  }
  else if (((IVar5 == BlockId) && (piVar1 = (int *)boolean[1].type.id, *piVar1 == 0xe)) &&
          (iVar4 = Literal::geti32((Literal *)(piVar1 + 4)), iVar4 == 0)) {
    return *(Expression **)(boolean + 2);
  }
  pEVar6 = Properties::getSignExtValue(boolean);
  if (pEVar6 != (Expression *)0x0) {
    bits = Properties::getSignExtBits(boolean);
    boolean = makeZeroExt(this,pEVar6,bits);
  }
  return boolean;
}

Assistant:

Expression* optimizeBoolean(Expression* boolean) {
    // TODO use a general getFallthroughs
    if (auto* unary = boolean->dynCast<Unary>()) {
      if (unary) {
        if (unary->op == EqZInt32) {
          auto* unary2 = unary->value->dynCast<Unary>();
          if (unary2 && unary2->op == EqZInt32) {
            // double eqz
            return unary2->value;
          }
          if (auto* binary = unary->value->dynCast<Binary>()) {
            // !(x <=> y)   ==>   x <!=> y
            auto op = invertBinaryOp(binary->op);
            if (op != InvalidBinary) {
              binary->op = op;
              return binary;
            }
          }
        }
      }
    } else if (auto* binary = boolean->dynCast<Binary>()) {
      if (binary->op == SubInt32) {
        if (auto* c = binary->left->dynCast<Const>()) {
          if (c->value.geti32() == 0) {
            // bool(0 - x)   ==>   bool(x)
            return binary->right;
          }
        }
      } else if (binary->op == OrInt32) {
        // an or flowing into a boolean context can consider each input as
        // boolean
        binary->left = optimizeBoolean(binary->left);
        binary->right = optimizeBoolean(binary->right);
      } else if (binary->op == NeInt32) {
        if (auto* c = binary->right->dynCast<Const>()) {
          // x != 0 is just x if it's used as a bool
          if (c->value.geti32() == 0) {
            return binary->left;
          }
          // TODO: Perhaps use it for separate final pass???
          // x != -1   ==>    x ^ -1
          // if (num->value.geti32() == -1) {
          //   binary->op = XorInt32;
          //   return binary;
          // }
        }
      } else if (binary->op == RemSInt32) {
        // bool(i32(x) % C_pot)  ==>  bool(x & (C_pot - 1))
        // bool(i32(x) % min_s)  ==>  bool(x & max_s)
        if (auto* c = binary->right->dynCast<Const>()) {
          if (c->value.isSignedMin() ||
              Bits::isPowerOf2(c->value.abs().geti32())) {
            binary->op = AndInt32;
            if (c->value.isSignedMin()) {
              c->value = Literal::makeSignedMax(Type::i32);
            } else {
              c->value = c->value.abs().sub(Literal::makeOne(Type::i32));
            }
            return binary;
          }
        }
      }
      if (auto* ext = Properties::getSignExtValue(binary)) {
        // use a cheaper zero-extent, we just care about the boolean value
        // anyhow
        return makeZeroExt(ext, Properties::getSignExtBits(binary));
      }
    } else if (auto* block = boolean->dynCast<Block>()) {
      if (block->type == Type::i32 && block->list.size() > 0) {
        block->list.back() = optimizeBoolean(block->list.back());
      }
    } else if (auto* iff = boolean->dynCast<If>()) {
      if (iff->type == Type::i32) {
        iff->ifTrue = optimizeBoolean(iff->ifTrue);
        iff->ifFalse = optimizeBoolean(iff->ifFalse);
      }
    } else if (auto* select = boolean->dynCast<Select>()) {
      select->ifTrue = optimizeBoolean(select->ifTrue);
      select->ifFalse = optimizeBoolean(select->ifFalse);
    } else if (auto* tryy = boolean->dynCast<Try>()) {
      if (tryy->type == Type::i32) {
        tryy->body = optimizeBoolean(tryy->body);
        for (Index i = 0; i < tryy->catchBodies.size(); i++) {
          tryy->catchBodies[i] = optimizeBoolean(tryy->catchBodies[i]);
        }
      }
    }
    // TODO: recurse into br values?
    return boolean;
  }